

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O2

void __thiscall
spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>::MoveToNextNode
          (PostOrderTreeDFIterator<spvtools::opt::Loop> *this)

{
  pointer ppLVar1;
  _Elt_pointer ppVar2;
  
  if (this->current_ != (NodePtr)0x0) {
    ppVar2 = (this->parent_iterators_).c.
             super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar2 != (this->parent_iterators_).c.
                  super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (ppVar2 == (this->parent_iterators_).c.
                    super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar2 = (this->parent_iterators_).c.
                 super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      ppLVar1 = ppVar2[-1].second._M_current;
      if (ppLVar1 !=
          ((ppVar2[-1].first)->nested_loops_).
          super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this->current_ = *ppLVar1;
        ppVar2[-1].second._M_current = ppLVar1 + 1;
        WalkToLeaf(this);
        return;
      }
      this->current_ = ppVar2[-1].first;
      std::
      deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
      ::pop_back(&(this->parent_iterators_).c);
      return;
    }
    this->current_ = (NodePtr)0x0;
  }
  return;
}

Assistant:

inline void MoveToNextNode() {
    if (!current_) return;
    if (parent_iterators_.empty()) {
      current_ = nullptr;
      return;
    }
    std::pair<NodePtr, NodeIterator>& next_it = parent_iterators_.top();
    // If we visited all children, the current node is the top of the stack.
    if (next_it.second == next_it.first->end()) {
      // Set the new node.
      current_ = next_it.first;
      parent_iterators_.pop();
      return;
    }
    // We have more children to visit, set the current node to the first child
    // and dive to leaf.
    current_ = *next_it.second;
    // Update the iterator for the next child (avoid unneeded pop).
    ++next_it.second;
    WalkToLeaf();
  }